

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O2

string * __thiscall
pbrt::ThinDielectricBxDF::ToString_abi_cxx11_
          (string *__return_storage_ptr__,ThinDielectricBxDF *this)

{
  float *in_RCX;
  
  StringPrintf<float_const&>
            (__return_storage_ptr__,(pbrt *)"[ ThinDielectricBxDF eta: %f ]",(char *)this,in_RCX);
  return __return_storage_ptr__;
}

Assistant:

std::string ThinDielectricBxDF::ToString() const {
    return StringPrintf("[ ThinDielectricBxDF eta: %f ]", eta);
}